

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiguresTests.cpp
# Opt level: O0

void __thiscall
agge::tests::RectangleTests::RewindingIteratorStartsOverWithPoints(RectangleTests *this)

{
  point pVar1;
  allocator local_1f1;
  string local_1f0 [32];
  LocationInfo local_1d0;
  point local_1a8;
  point local_198;
  undefined8 local_188;
  real_t local_180;
  undefined8 local_178;
  real_t local_170;
  point local_168;
  undefined1 local_158 [8];
  point reference [6];
  real_t local_f8;
  int iStack_f4;
  real_t local_f0;
  real_t local_e8;
  int iStack_e4;
  real_t local_e0;
  real_t local_d8;
  int iStack_d4;
  real_t local_d0;
  real_t local_c8;
  int iStack_c4;
  real_t local_c0;
  point local_b8;
  undefined1 local_a8 [8];
  point points [6];
  undefined1 local_24 [8];
  rectangle r;
  RectangleTests *this_local;
  
  r._12_8_ = this;
  rectangle::rectangle((rectangle *)local_24,10.1,20.2,30.0,4.7);
  vertex<agge::rectangle>((rectangle *)local_24);
  join_0x00000000_0x00001200_ = vertex<agge::rectangle>((rectangle *)local_24);
  rectangle::rewind((rectangle *)local_24,(FILE *)0x0);
  pVar1 = vertex<agge::rectangle>((rectangle *)local_24);
  local_b8.command = pVar1.command;
  points[0].x = (real_t)local_b8.command;
  local_b8._0_8_ = pVar1._0_8_;
  local_a8._0_4_ = local_b8.x;
  local_a8._4_4_ = local_b8.y;
  pVar1 = vertex<agge::rectangle>((rectangle *)local_24);
  local_c0 = (real_t)pVar1.command;
  points[1].x = local_c0;
  _local_c8 = pVar1._0_8_;
  points[0].y = local_c8;
  points[0].command = iStack_c4;
  pVar1 = vertex<agge::rectangle>((rectangle *)local_24);
  local_d0 = (real_t)pVar1.command;
  points[2].x = local_d0;
  _local_d8 = pVar1._0_8_;
  points[1].y = local_d8;
  points[1].command = iStack_d4;
  pVar1 = vertex<agge::rectangle>((rectangle *)local_24);
  local_e0 = (real_t)pVar1.command;
  points[3].x = local_e0;
  _local_e8 = pVar1._0_8_;
  points[2].y = local_e8;
  points[2].command = iStack_e4;
  pVar1 = vertex<agge::rectangle>((rectangle *)local_24);
  local_f0 = (real_t)pVar1.command;
  points[4].x = local_f0;
  _local_f8 = pVar1._0_8_;
  points[3].y = local_f8;
  points[3].command = iStack_f4;
  pVar1 = vertex<agge::rectangle>((rectangle *)local_24);
  points[5].x = (real_t)pVar1.command;
  points[4]._4_8_ = pVar1._0_8_;
  pVar1 = moveto(10.1,20.2);
  local_168.command = pVar1.command;
  local_168._0_8_ = pVar1._0_8_;
  local_158 = (undefined1  [8])local_168._0_8_;
  reference[0].x = (real_t)local_168.command;
  pVar1 = lineto(30.0,20.2);
  local_170 = (real_t)pVar1.command;
  local_178 = pVar1._0_8_;
  reference[0]._4_8_ = local_178;
  reference[1].x = local_170;
  pVar1 = lineto(30.0,4.7);
  local_180 = (real_t)pVar1.command;
  local_188 = pVar1._0_8_;
  reference[1]._4_8_ = local_188;
  reference[2].x = local_180;
  pVar1 = lineto(10.1,4.7);
  local_198.command = pVar1.command;
  reference[3].x = (real_t)local_198.command;
  local_198._0_8_ = pVar1._0_8_;
  reference[2].y = local_198.x;
  reference[2].command = (int)local_198.y;
  reference[3].y = 0.0;
  reference[3].command = 0;
  reference[4].x = 6.72623e-44;
  local_198 = pVar1;
  pVar1 = stop();
  local_1a8.command = pVar1.command;
  reference[5].x = (real_t)local_1a8.command;
  local_1a8._0_8_ = pVar1._0_8_;
  reference[4].y = local_1a8.x;
  reference[4].command = (int)local_1a8.y;
  local_1a8 = pVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_1f1);
  ut::LocationInfo::LocationInfo(&local_1d0,(string *)local_1f0,0x99);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])local_158,(point (*) [6])local_a8,&local_1d0);
  ut::LocationInfo::~LocationInfo(&local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  return;
}

Assistant:

test( RewindingIteratorStartsOverWithPoints )
			{
				// INIT
				rectangle r(10.1f, 20.2f, 30.0f, 4.7f);

				vertex(r), vertex(r);

				// ACT
				r.rewind(0);

				// ASSERT
				mocks::path::point points[] = { vertex(r), vertex(r), vertex(r), vertex(r), vertex(r), vertex(r), };
				mocks::path::point reference[] = {
					moveto(10.1f, 20.2f), lineto(30.0f, 20.2f), lineto(30.0f, 4.7f), lineto(10.1f, 4.7f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close }, stop(),
				};

				assert_equal(reference, points);
			}